

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

AuxNode * kj::_::
          CopyConstructArray_<capnp::compiler::NodeTranslator::AuxNode,_capnp::compiler::NodeTranslator::AuxNode_*,_true,_false>
          ::apply(AuxNode *pos,AuxNode *start,AuxNode *end)

{
  CapTableBuilder *pCVar1;
  AuxNode *pAVar2;
  ExceptionGuard local_18;
  
  local_18.pos = pos;
  if (start != end) {
    do {
      (pos->node).builder.segment = (start->node).builder.segment;
      (pos->node).builder.capTable = (start->node).builder.capTable;
      (pos->node).builder.location = (start->node).builder.location;
      (pos->node).builder.tag.content = (start->node).builder.tag.content;
      (start->node).builder.segment = (SegmentBuilder *)0x0;
      (start->node).builder.location = (word *)0x0;
      pCVar1 = (start->sourceInfo).builder.capTable;
      (pos->sourceInfo).builder.segment = (start->sourceInfo).builder.segment;
      (pos->sourceInfo).builder.capTable = pCVar1;
      (pos->sourceInfo).builder.location = (start->sourceInfo).builder.location;
      (pos->sourceInfo).builder.tag.content = (start->sourceInfo).builder.tag.content;
      (start->sourceInfo).builder.segment = (SegmentBuilder *)0x0;
      (start->sourceInfo).builder.location = (word *)0x0;
      start = start + 1;
      pos = pos + 1;
      local_18.pos = pos;
    } while (start != end);
  }
  pAVar2 = local_18.pos;
  local_18.start = local_18.pos;
  ExceptionGuard::~ExceptionGuard(&local_18);
  return pAVar2;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }